

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O1

void __thiscall unitStrings_nan_Test::~unitStrings_nan_Test(unitStrings_nan_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStrings, nan)
{
    EXPECT_EQ(to_string(precise::error), "ERROR");

    EXPECT_EQ(to_string(precise::invalid), "NaN*ERROR");
    auto nanunit =
        precise_unit(std::numeric_limits<double>::quiet_NaN(), precise::one);
    auto res = to_string(nanunit);
    EXPECT_EQ(res, "NaN");
    auto nanresult = unit_from_string(res);
    EXPECT_TRUE(isnan(nanresult));
    EXPECT_EQ(to_string(nanunit * precise::m / precise::s), "NaN*m/s");

    EXPECT_EQ(
        to_string(unit(std::numeric_limits<double>::signaling_NaN(), m / s)),
        "NaN*m/s");
    auto retunit = unit_from_string("NaN*m/s");
    EXPECT_EQ(retunit.base_units(), (precise::m / precise::s).base_units());
    EXPECT_TRUE(isnan(retunit));
}